

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O2

bool __thiscall TripleBuffer<stStateCore>::update(TripleBuffer<stStateCore> *this,bool force)

{
  int32_t iVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  byte bVar3;
  int iVar4;
  pthread_mutex_t *__mutex;
  int local_3c;
  pthread_mutex_t *local_38;
  
  __mutex = (pthread_mutex_t *)&this->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  bVar3 = this->hasChanged ^ 1U | force;
  if (bVar3 == 1) {
    this->hasChanged = true;
    local_38 = __mutex;
    memcpy(&this->buffer,this,0x82);
    if ((this->super_stStateCore).flags.updateSimilarityMap == true) {
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::operator=(&(this->buffer).similarityMap,&(this->super_stStateCore).similarityMap);
    }
    iVar4 = 0;
    while( true ) {
      local_3c = iVar4;
      iVar1 = stParameters::nProcessors(&(this->super_stStateCore).params);
      if (iVar1 <= iVar4) break;
      if ((this->super_stStateCore).flags.updateResult[local_3c] == true) {
        pmVar2 = std::
                 map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                 ::operator[](&(this->super_stStateCore).processors,&local_3c);
        this_00 = std::
                  map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                  ::operator[](&(this->buffer).processors,&local_3c);
        Cipher::Processor::operator=(this_00,pmVar2);
      }
      iVar4 = local_3c + 1;
    }
    memset(this,0,0x82);
    __mutex = local_38;
  }
  pthread_mutex_unlock(__mutex);
  return (bool)bVar3;
}

Assistant:

bool TripleBuffer<stStateCore>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.updateSimilarityMap) {
        buffer.similarityMap = this->similarityMap;
    }

    for (int i = 0; i < this->params.nProcessors(); ++i) {
        if (this->flags.updateResult[i]) {
            buffer.processors[i] = this->processors[i];
        }
    }

    this->flags.clear();

    return true;
}